

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O2

size_t __thiscall pstore::repo::generic_section::size_bytes(generic_section *this)

{
  size_type data_size;
  size_type num_ifixups;
  size_type num_xfixups;
  size_t sVar1;
  container<pstore::repo::external_fixup> local_48;
  container<pstore::repo::internal_fixup> local_38;
  container<unsigned_char> local_28;
  
  local_28 = payload(this);
  data_size = container<unsigned_char>::size(&local_28);
  local_38 = ifixups(this);
  num_ifixups = container<pstore::repo::internal_fixup>::size(&local_38);
  local_48 = xfixups(this);
  num_xfixups = container<pstore::repo::external_fixup>::size(&local_48);
  sVar1 = size_bytes(data_size,num_ifixups,num_xfixups);
  return sVar1;
}

Assistant:

std::size_t generic_section::size_bytes () const {
            return generic_section::size_bytes (payload ().size (), ifixups ().size (),
                                                xfixups ().size ());
        }